

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::tri_edge_2d
          (tetgenmesh *this,point A,point B,point C,point P,point Q,point R,int level,int *types,
          int *pos)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  point pdVar5;
  point pdVar6;
  point pdVar7;
  point pdVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double abovept [3];
  int local_b4;
  uint local_b0;
  uint local_a8;
  point local_90;
  uint local_88;
  uint local_78;
  undefined1 local_68 [16];
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  if (R == (point)0x0) {
    facenormal(this,A,B,C,(double *)local_68,1,(double *)0x0);
    dVar9 = SQRT(local_58 * local_58 +
                 local_68._0_8_ * local_68._0_8_ + local_68._8_8_ * local_68._8_8_);
    if ((dVar9 == 0.0) && (!NAN(dVar9))) {
      return 0;
    }
    auVar10._8_4_ = SUB84(dVar9,0);
    auVar10._0_8_ = dVar9;
    auVar10._12_4_ = (int)((ulong)dVar9 >> 0x20);
    auVar10 = divpd(local_68,auVar10);
    local_38 = A[2];
    dVar11 = local_38 - C[2];
    local_48 = *A;
    dStack_40 = A[1];
    dVar12 = B[1];
    dVar18 = B[2] - local_38;
    dVar19 = C[2] - B[2];
    dVar15 = *B - local_48;
    dVar16 = *C - *B;
    auVar13._8_8_ = dVar12;
    auVar13._0_8_ = dStack_40;
    dVar17 = C[1] - dVar12;
    auVar14._8_8_ = dVar19 * dVar19 + dVar16 * dVar16 + dVar17 * dVar17;
    auVar14._0_8_ = dVar18 * dVar18 + dVar15 * dVar15 + (dVar12 - dStack_40) * (dVar12 - dStack_40);
    auVar14 = sqrtpd(auVar13,auVar14);
    dVar15 = local_48 - *C;
    dVar12 = dStack_40 - C[1];
    dVar12 = (SQRT(dVar11 * dVar11 + dVar15 * dVar15 + dVar12 * dVar12) +
             auVar14._8_8_ + auVar14._0_8_) / 3.0;
    local_48 = dVar12 * auVar10._0_8_ + local_48;
    dStack_40 = dVar12 * auVar10._8_8_ + dStack_40;
    R = &local_48;
    local_38 = dVar12 * (local_58 / dVar9) + local_38;
  }
  dVar9 = orient3d(P,Q,R,A);
  dVar12 = orient3d(P,Q,R,B);
  dVar11 = orient3d(P,Q,R,C);
  pdVar6 = A;
  pdVar7 = B;
  pdVar8 = Q;
  local_90 = P;
  if (0.0 <= dVar9) {
    pdVar5 = A;
    if (0.0 < dVar9) {
      if (0.0 <= dVar12) {
        if (dVar12 <= 0.0) {
          if (dVar11 < 0.0) {
            local_b4 = 1;
            local_a8 = 2;
            local_88 = 0;
            local_b0 = 1;
            local_78 = 0;
            pdVar7 = A;
            pdVar6 = B;
            A = C;
            pdVar8 = Q;
            goto LAB_00111a09;
          }
          local_b0 = (uint)(dVar11 <= 0.0);
          bVar2 = 0.0 < dVar11;
          local_88 = (uint)bVar2;
          pdVar5 = C;
          if (0.0 < dVar11) {
            pdVar6 = B;
            pdVar7 = C;
            pdVar8 = P;
            pdVar5 = A;
            local_90 = Q;
          }
          A = pdVar5;
          local_a8 = (uint)(dVar11 <= 0.0) * 2;
          local_b4 = bVar2 + 1;
          bVar3 = false;
          local_78 = local_88;
          goto LAB_00111c50;
        }
        local_a8 = 1;
        pdVar5 = C;
        if (0.0 <= dVar11) {
          if (0.0 < dVar11) {
            return 0;
          }
          local_b4 = 0;
          local_88 = 2;
          local_b0 = 0;
          local_78 = 1;
          pdVar7 = A;
          A = B;
          pdVar8 = P;
          local_90 = Q;
          goto LAB_001116a2;
        }
        local_88 = 2;
        local_b4 = 0;
        local_b0 = 0;
        local_78 = 1;
        pdVar7 = A;
        A = B;
        pdVar8 = P;
        local_90 = Q;
      }
      else {
        if (0.0 <= dVar11) {
          bVar1 = 0.0 < dVar11;
          bVar3 = dVar11 <= 0.0;
          local_b4 = 2;
          local_a8 = 0;
          local_88 = 1;
          local_b0 = 0;
          local_78 = 1;
          bVar2 = false;
          local_90 = Q;
          goto LAB_001116b2;
        }
        local_b4 = 1;
        local_a8 = 2;
        local_88 = 0;
        local_b0 = 1;
        local_78 = 0;
        A = C;
      }
LAB_0011164f:
      bVar1 = true;
      bVar2 = false;
      C = pdVar7;
      goto LAB_001116aa;
    }
    pdVar6 = C;
    pdVar7 = A;
    if (0.0 <= dVar12) {
      if (dVar12 <= 0.0) {
        local_88 = 2;
        bVar2 = 0.0 <= dVar11;
        if (!bVar2) {
          pdVar8 = P;
          local_90 = Q;
        }
        bVar4 = !bVar2 || 0.0 < dVar11;
        local_78 = (uint)!bVar2;
        local_a8 = 1;
        local_b0 = (uint)bVar2;
        local_b4 = 0;
        bVar2 = false;
        bVar1 = false;
        bVar3 = false;
        A = B;
        goto LAB_001116ba;
      }
      if (dVar11 < 0.0) {
        local_b4 = 0;
        local_a8 = 1;
        local_88 = 2;
        local_b0 = 0;
        local_78 = 1;
        pdVar7 = C;
        pdVar6 = A;
        A = B;
        pdVar8 = P;
        local_90 = Q;
LAB_00111a09:
        P = pdVar8;
        C = pdVar6;
        B = pdVar7;
        bVar3 = true;
        bVar2 = false;
        bVar1 = false;
        goto LAB_001116b2;
      }
      bVar2 = 0.0 < dVar11;
      local_78 = (uint)bVar2;
      pdVar6 = B;
      pdVar7 = C;
      if (0.0 < dVar11) {
        pdVar6 = A;
        A = C;
        pdVar8 = P;
        pdVar7 = B;
        local_90 = Q;
      }
      local_b0 = (uint)(dVar11 <= 0.0);
      local_a8 = (uint)bVar2 * 2;
      local_b4 = 2 - (uint)bVar2;
      bVar3 = false;
      local_88 = local_b0;
    }
    else {
      if (dVar11 < 0.0) {
        local_b4 = 1;
        local_a8 = 2;
        local_88 = 0;
        local_b0 = 1;
        local_78 = 0;
        pdVar7 = B;
        A = C;
LAB_001116a2:
        bVar2 = true;
        bVar1 = false;
        C = pdVar7;
        goto LAB_001116aa;
      }
      local_78 = (uint)(dVar11 <= 0.0);
      bVar3 = 0.0 < dVar11;
      local_a8 = (uint)bVar3;
      pdVar5 = B;
      if (dVar11 <= 0.0) {
        pdVar6 = B;
        pdVar7 = C;
        pdVar8 = P;
        pdVar5 = A;
        local_90 = Q;
      }
      A = pdVar5;
      local_88 = bVar3 + 1;
      local_b4 = (uint)(dVar11 <= 0.0) * 2;
      bVar2 = false;
      local_b0 = local_a8;
    }
LAB_00111c50:
    bVar4 = dVar11 <= 0.0;
    bVar1 = false;
  }
  else {
    if (0.0 <= dVar12) {
      pdVar5 = B;
      if (dVar12 <= 0.0) {
        if (dVar11 < 0.0) {
          local_b4 = 2;
          local_a8 = 0;
          local_88 = 1;
          local_b0 = 1;
          local_78 = 0;
          pdVar7 = C;
          goto LAB_001116a2;
        }
        bVar3 = 0.0 < dVar11;
        bVar4 = dVar11 <= 0.0;
        local_b4 = 1;
        local_a8 = 2;
        local_88 = 0;
        local_b0 = 0;
        local_78 = 1;
        bVar2 = false;
        bVar1 = false;
        A = C;
        pdVar8 = P;
        local_90 = Q;
        goto LAB_001116ba;
      }
      if (dVar11 < 0.0) {
        local_b4 = 2;
        local_a8 = 0;
        local_88 = 1;
        local_b0 = 1;
        local_78 = 0;
        pdVar7 = C;
        goto LAB_0011164f;
      }
      bVar1 = 0.0 < dVar11;
      local_78 = (uint)bVar1;
      pdVar6 = Q;
      if (0.0 < dVar11) {
        pdVar7 = A;
        A = C;
        pdVar6 = P;
        C = B;
        local_90 = Q;
      }
      P = pdVar6;
      B = pdVar7;
      bVar3 = dVar11 <= 0.0;
      local_b0 = (uint)bVar3;
      local_a8 = (uint)bVar1 * 2;
      local_b4 = 2 - (uint)bVar1;
      bVar2 = false;
      local_88 = local_b0;
    }
    else {
      if (dVar11 < 0.0) {
        return 0;
      }
      bVar1 = 0.0 < dVar11;
      bVar2 = dVar11 <= 0.0;
      local_b4 = 0;
      local_a8 = 1;
      local_88 = 2;
      local_b0 = 1;
      local_78 = 0;
      pdVar5 = C;
      C = A;
      A = B;
      pdVar8 = Q;
LAB_001116aa:
      P = pdVar8;
      B = pdVar5;
      bVar3 = false;
    }
LAB_001116b2:
    bVar4 = false;
    pdVar6 = B;
    pdVar7 = C;
    pdVar8 = P;
  }
LAB_001116ba:
  dVar9 = orient3d(pdVar7,pdVar6,R,pdVar8);
  dVar12 = orient3d(A,pdVar6,R,local_90);
  if (0.0 < dVar9) {
    return 0;
  }
  if (dVar12 < 0.0) {
    return 0;
  }
  if (level == 0) {
    return 1;
  }
  if (bVar2) {
    if ((dVar9 != 0.0) || (NAN(dVar9))) {
      if ((dVar12 != 0.0) || (NAN(dVar12))) {
        *types = 7;
      }
      else {
        *types = 2;
      }
      *pos = local_88;
    }
    else {
      *types = 2;
      *pos = local_88;
      local_78 = local_b0;
    }
  }
  else {
    dVar11 = orient3d(pdVar7,pdVar6,R,local_90);
    dVar15 = orient3d(A,pdVar6,R,pdVar8);
    if (bVar1) {
      if (0.0 <= dVar9) {
        *types = 5;
        *pos = local_88;
        pos[1] = local_b0;
        goto LAB_00111cc3;
      }
      if (0.0 < dVar11) {
        if (dVar15 <= 0.0) {
          *types = 8;
LAB_00111e39:
          *pos = local_88;
          goto LAB_00111e40;
        }
        *types = 8;
      }
      else {
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          if (dVar12 <= 0.0) {
            *types = 5;
            *pos = local_a8;
            pos[1] = local_78;
            goto LAB_00111cc3;
          }
          if (0.0 < dVar15) {
            *types = 6;
            *pos = 3;
            pos[1] = local_78;
            types[1] = 6;
            pos[2] = 3;
            goto LAB_00111e58;
          }
          *types = 6;
          *pos = 3;
LAB_00111e40:
          pos[1] = local_78;
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            types[1] = 8;
            pos[2] = local_a8;
            pos[3] = local_78;
            return 4;
          }
          types[1] = 5;
          pos[2] = local_a8;
          goto LAB_00111e58;
        }
        if (dVar15 <= 0.0) {
          *types = 5;
          goto LAB_00111e39;
        }
        *types = 5;
      }
      *pos = local_88;
      pos[1] = local_78;
      types[1] = 6;
      pos[2] = 3;
LAB_00111e58:
      pos[3] = local_b0;
      return 4;
    }
    if (!bVar3) {
      if (!bVar4) {
        return 4;
      }
      if (0.0 <= dVar9) {
        *types = 2;
        *pos = local_b4;
        pos[1] = local_b0;
        goto LAB_00111de8;
      }
      if (dVar11 <= 0.0) {
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          if (0.0 < dVar12) {
            if (0.0 < dVar15) {
              *types = 5;
              *pos = local_b4;
              pos[1] = local_78;
              types[1] = 5;
              pos[2] = local_b4;
              pos[3] = local_b0;
              return 4;
            }
            *types = 5;
            goto LAB_00111f6b;
          }
          *types = 2;
          *pos = local_a8;
        }
        else {
          if (0.0 < dVar15) {
            *types = 2;
            goto LAB_00111ead;
          }
          if ((dVar15 != 0.0) || (NAN(dVar15))) {
            *types = 2;
            *pos = local_b4;
            pos[1] = local_78;
            goto LAB_00112095;
          }
          *types = 3;
          *pos = local_b4;
        }
        pos[1] = local_78;
LAB_00111de8:
        types[1] = 0;
        return 4;
      }
      if (dVar15 <= 0.0) {
        *types = 7;
LAB_00111f6b:
        *pos = local_b4;
        pos[1] = local_78;
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
LAB_00112095:
          types[1] = 7;
          pos[2] = local_a8;
          pos[3] = local_78;
          return 4;
        }
        types[1] = 2;
        pos[2] = local_a8;
        goto LAB_00111f99;
      }
      *types = 7;
LAB_00111ead:
      *pos = local_b4;
      pos[1] = local_78;
      types[1] = 5;
      pos[2] = local_b4;
LAB_00111f99:
      pos[3] = local_b0;
      return 4;
    }
    if (dVar9 < 0.0) {
      if (dVar11 <= 0.0) {
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          if (0.0 < dVar12) {
            if (dVar15 <= 0.0) {
              if ((dVar15 != 0.0) || (NAN(dVar15))) {
                *types = 8;
                *pos = local_a8;
                pos[1] = local_78;
                return 4;
              }
              *types = 5;
              *pos = local_a8;
            }
            else {
              *types = 6;
              *pos = 3;
            }
            pos[1] = local_b0;
            return 4;
          }
          *types = 5;
          *pos = local_a8;
          pos[1] = local_78;
          goto LAB_00111cc3;
        }
        if (0.0 < dVar15) {
          *types = 2;
          goto LAB_00111dac;
        }
        *types = 2;
      }
      else {
        if (0.0 < dVar15) {
          *types = 7;
LAB_00111dac:
          *pos = local_b4;
          pos[1] = local_78;
          types[1] = 6;
          pos[2] = 3;
          goto LAB_00111f3d;
        }
        *types = 7;
      }
      *pos = local_b4;
      pos[1] = local_78;
      if ((dVar15 != 0.0) || (NAN(dVar15))) {
        types[1] = 8;
        pos[2] = local_a8;
        pos[3] = local_78;
        return 4;
      }
      types[1] = 5;
      pos[2] = local_a8;
LAB_00111f3d:
      pos[3] = local_b0;
      return 4;
    }
    *types = 2;
    *pos = local_b4;
    local_78 = local_b0;
  }
  pos[1] = local_78;
LAB_00111cc3:
  types[1] = 0;
  return 4;
}

Assistant:

int tetgenmesh::tri_edge_2d(point A, point B, point C, point P, point Q, 
                            point R, int level, int *types, int *pos)
{
  point U[3], V[3];  // The permuted vectors of points.
  int pu[3], pv[3];  // The original positions of points.
  REAL abovept[3];
  REAL sA, sB, sC;
  REAL s1, s2, s3, s4;
  int z1;

  if (R == NULL) {
    // Calculate a lift point.
    if (1) {
      REAL n[3], len;
      // Calculate a lift point, saved in dummypoint.
      facenormal(A, B, C, n, 1, NULL);
      len = sqrt(dot(n, n));
      if (len != 0) {
        n[0] /= len;
        n[1] /= len;
        n[2] /= len;
        len = distance(A, B);
        len += distance(B, C);
        len += distance(C, A);
        len /= 3.0;
        R = abovept; //dummypoint;
        R[0] = A[0] + len * n[0];
        R[1] = A[1] + len * n[1];
        R[2] = A[2] + len * n[2];
      } else {
        // The triangle [A,B,C] is (nearly) degenerate, i.e., it is (close)
        //   to a line.  We need a line-line intersection test.
        // !!! A non-save return value.!!!
        return 0;  // DISJOINT
      }
    }
  }

  // Test A's, B's, and C's orientations wrt plane PQR. 
  sA = orient3d(P, Q, R, A);
  sB = orient3d(P, Q, R, B);
  sC = orient3d(P, Q, R, C);


  if (sA < 0) {
    if (sB < 0) {
      if (sC < 0) { // (---).
        return 0; 
      } else {
        if (sC > 0) { // (--+).
          // All points are in the right positions.
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else { // (--0).
          SETVECTOR3(U, A, B, C);  // I3
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 0, 1, 2);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        }
      }
    } else { 
      if (sB > 0) {
        if (sC < 0) { // (-+-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (-++).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (-+0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          }
        }
      } else {
        if (sC < 0) { // (-0-).
          SETVECTOR3(U, C, A, B);  // PT = ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 2, 0, 1);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (-0+).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else { // (-00).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      }
    }
  } else {
    if (sA > 0) {
      if (sB < 0) {
        if (sC < 0) { // (+--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 0;
        } else {
          if (sC > 0) { // (+-+).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else { // (+-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (++-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 0;
          } else {
            if (sC > 0) { // (+++).
              return 0; 
            } else { // (++0).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1; 
            }
          }
        } else { // (+0#)
          if (sC < 0) { // (+0-).
            SETVECTOR3(U, B, C, A);  // PT = ST x ST
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 1, 2, 0);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (+0+).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (+00).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        }
      }
    } else { 
      if (sB < 0) {
        if (sC < 0) { // (0--).
          SETVECTOR3(U, B, C, A);  // PT = ST x ST
          SETVECTOR3(V, P, Q, R);  // I2
          SETVECTOR3(pu, 1, 2, 0);
          SETVECTOR3(pv, 0, 1, 2);
          z1 = 1;
        } else {
          if (sC > 0) { // (0-+).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, P, Q, R);  // I2
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 0, 1, 2);
            z1 = 2;
          } else { // (0-0).
            SETVECTOR3(U, C, A, B);  // PT = ST
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 2, 0, 1);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          }
        }
      } else { 
        if (sB > 0) {
          if (sC < 0) { // (0+-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 2;
          } else {
            if (sC > 0) { // (0++).
              SETVECTOR3(U, B, C, A);  // PT = ST x ST
              SETVECTOR3(V, Q, P, R);  // PL = SL
              SETVECTOR3(pu, 1, 2, 0);
              SETVECTOR3(pv, 1, 0, 2);
              z1 = 1;
            } else { // (0+0).
              SETVECTOR3(U, C, A, B);  // PT = ST
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 2, 0, 1);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            }
          }
        } else { // (00#)
          if (sC < 0) { // (00-).
            SETVECTOR3(U, A, B, C);  // I3
            SETVECTOR3(V, Q, P, R);  // PL = SL
            SETVECTOR3(pu, 0, 1, 2);
            SETVECTOR3(pv, 1, 0, 2);
            z1 = 3; 
          } else {
            if (sC > 0) { // (00+).
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 3; 
            } else { // (000)
              // Not possible unless ABC is degenerate.
              // Avoiding compiler warnings.
              SETVECTOR3(U, A, B, C);  // I3
              SETVECTOR3(V, P, Q, R);  // I2
              SETVECTOR3(pu, 0, 1, 2);
              SETVECTOR3(pv, 0, 1, 2);
              z1 = 4;
            }
          }
        }
      }
    }
  }

  s1 = orient3d(U[0], U[2], R, V[1]);  // A, C, R, Q
  s2 = orient3d(U[1], U[2], R, V[0]);  // B, C, R, P

  if (s1 > 0) {
    return 0;
  }
  if (s2 < 0) {
    return 0;
  }

  if (level == 0) {
    return 1;  // They are intersected.
  }


  if (z1 == 1) {
    if (s1 == 0) {  // (0###)
      // C = Q.
      types[0] = (int) SHAREVERT;
      pos[0] = pu[2]; // C
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    } else {
      if (s2 == 0) { // (#0##)
        // C = P.
        types[0] = (int) SHAREVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // P
        types[1] = (int) DISJOINT;
      } else { // (-+##)
        // C in [P, Q].
        types[0] = (int) ACROSSVERT;
        pos[0] = pu[2]; // C
        pos[1] = pv[0]; // [P, Q]
        types[1] = (int) DISJOINT;
      }
    }
    return 4;
  }

  s3 = orient3d(U[0], U[2], R, V[0]);  // A, C, R, P
  s4 = orient3d(U[1], U[2], R, V[1]);  // B, C, R, Q
      
  if (z1 == 0) {  // (tritri-03)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [k, l] (-+++).
          types[0] = (int) ACROSSEDGE;
          pos[0] = pu[2]; // [C, A]
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [k, l] (-++0).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [k, l] (-++-).
            types[0] = (int) ACROSSEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = k, [P, Q] in [k, l] (-+0+).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[2]; // [C, A]
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [k, l] (-+00).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else {
              // P = k, [P, Q] contains [k, l] (-+0-).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[2]; // [C, A]
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [k, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHFACE;
              pos[2] = 3;     // [A, B, C]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [k, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) TOUCHEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [k, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSEDGE;
                pos[2] = pu[1]; // [B, C]
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = k (0####)
      types[0] = (int) TOUCHEDGE;
      pos[0] = pu[2]; // [C, A]
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 2) {  // (tritri-23)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, l] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHFACE;
          pos[2] = 3;     // [A, B, C]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = l, [P, Q] contains [A, l] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, l] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSEDGE;
            pos[2] = pu[1]; // [B, C]
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, l] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHFACE;
            pos[2] = 3;     // [A, B, C]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, l] (-+00).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[1]; // Q
            } else { // s4 < 0
              // Q = l, [P, Q] in [A, l] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSEDGE;
              pos[2] = pu[1]; // [B, C]
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, l] (-+-+).
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[0]; // P
              types[0] = (int) TOUCHFACE;
              pos[0] = 3;     // [A, B, C]
              pos[1] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = l, [P, Q] in [A, l] (-+-0).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, l] (-+--).
                types[0] = (int) TOUCHFACE;
                pos[0] = 3;     // [A, B, C]
                pos[1] = pv[0]; // P
                types[0] = (int) ACROSSEDGE;
                pos[0] = pu[1]; // [B, C]
                pos[1] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = l (#0##).
            types[0] = (int) TOUCHEDGE;
            pos[0] = pu[1]; // [B, C]
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  } else if (z1 == 3) {  // (tritri-33)
    if (s1 < 0) {
      if (s3 > 0) {
        if (s4 > 0) {
          // [P, Q] overlaps [A, B] (-+++).
          types[0] = (int) ACROSSVERT;
          pos[0] = pu[0]; // A
          pos[1] = pv[0]; // [P, Q]
          types[1] = (int) TOUCHEDGE;
          pos[2] = pu[0]; // [A, B]
          pos[3] = pv[1]; // Q
        } else {
          if (s4 == 0) {
            // Q = B, [P, Q] contains [A, B] (-++0).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) SHAREVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[1]; // Q
          } else { // s4 < 0
            // [P, Q] contains [A, B] (-++-).
            types[0] = (int) ACROSSVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // [P, Q]
            types[1] = (int) ACROSSVERT;
            pos[2] = pu[1]; // B
            pos[3] = pv[0]; // [P, Q]
          }
        }
      } else {
        if (s3 == 0) {
          if (s4 > 0) {
            // P = A, [P, Q] in [A, B] (-+0+).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[0]; // A
            pos[1] = pv[0]; // P
            types[1] = (int) TOUCHEDGE;
            pos[2] = pu[0]; // [A, B]
            pos[3] = pv[1]; // Q
          } else {
            if (s4 == 0) {
              // [P, Q] = [A, B] (-+00).
              types[0] = (int) SHAREEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // [P, Q]
              types[1] = (int) DISJOINT;
            } else { // s4 < 0
              // P= A, [P, Q] in [A, B] (-+0-).
              types[0] = (int) SHAREVERT;
              pos[0] = pu[0]; // A
              pos[1] = pv[0]; // P
              types[1] = (int) ACROSSVERT;
              pos[2] = pu[1]; // B
              pos[3] = pv[0]; // [P, Q]
            }
          }
        } else { // s3 < 0
          if (s2 > 0) {
            if (s4 > 0) {
              // [P, Q] in [A, B] (-+-+).
              types[0] = (int) TOUCHEDGE;
              pos[0] = pu[0]; // [A, B]
              pos[1] = pv[0]; // P
              types[1] = (int) TOUCHEDGE;
              pos[2] = pu[0]; // [A, B]
              pos[3] = pv[1]; // Q
            } else {
              if (s4 == 0) {
                // Q = B, [P, Q] in [A, B] (-+-0).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) SHAREVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[1]; // Q
              } else { // s4 < 0
                // [P, Q] overlaps [A, B] (-+--).
                types[0] = (int) TOUCHEDGE;
                pos[0] = pu[0]; // [A, B]
                pos[1] = pv[0]; // P
                types[1] = (int) ACROSSVERT;
                pos[2] = pu[1]; // B
                pos[3] = pv[0]; // [P, Q]
              }
            }
          } else { // s2 == 0
            // P = B (#0##).
            types[0] = (int) SHAREVERT;
            pos[0] = pu[1]; // B
            pos[1] = pv[0]; // P
            types[1] = (int) DISJOINT;
          }
        }
      }
    } else { // s1 == 0
      // Q = A (0###).
      types[0] = (int) SHAREVERT;
      pos[0] = pu[0]; // A
      pos[1] = pv[1]; // Q
      types[1] = (int) DISJOINT;
    }
  }

  return 4;
}